

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O0

bool __thiscall
soplex::SoPlexBase<double>::getPrimalReal(SoPlexBase<double> *this,double *p_vector,int size)

{
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> __first;
  bool bVar1;
  int iVar2;
  iterator __result;
  int in_EDX;
  SoPlexBase<double> *in_RDI;
  VectorBase<double> *primal;
  undefined4 in_stack_ffffffffffffffb8;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> __last;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar3;
  bool local_1;
  
  bVar1 = hasSol(in_RDI);
  if ((bVar1) && (iVar3 = in_EDX, iVar2 = numCols((SoPlexBase<double> *)0x1d7449), iVar2 <= in_EDX))
  {
    _syncRealSolution(in_RDI);
    __last._M_current = (double *)&in_RDI->_solReal;
    __result = VectorBase<double>::begin
                         ((VectorBase<double> *)CONCAT44(in_EDX,in_stack_ffffffffffffffb8));
    VectorBase<double>::end((VectorBase<double> *)CONCAT44(in_EDX,in_stack_ffffffffffffffb8));
    __first._M_current._4_4_ = iVar3;
    __first._M_current._0_4_ = in_stack_ffffffffffffffe0;
    std::
    copy<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double*>
              (__first,__last,__result._M_current);
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool SoPlexBase<R>::getPrimalReal(R* p_vector, int size)
{
   if(hasSol() && size >= numCols())
   {
      _syncRealSolution();

      auto& primal = _solReal._primal;
      std::copy(primal.begin(), primal.end(), p_vector);

      return true;
   }
   else
      return false;
}